

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeRTASParallelOperationDestroyExp
          (ze_rtas_parallel_operation_exp_handle_t hParallelOperation)

{
  _ze_rtas_parallel_operation_exp_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hParallelOperation + 8) + 0x80) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_rtas_parallel_operation_exp_handle_t **)hParallelOperation;
    zVar1 = (**(code **)(*(long *)(hParallelOperation + 8) + 0x80))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
      ::release((singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
                 *)(context + 0x6c0),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationDestroyExp(
        ze_rtas_parallel_operation_exp_handle_t hParallelOperation  ///< [in][release] handle of parallel operation object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_rtas_parallel_operation_exp_object_t*>( hParallelOperation )->dditable;
        auto pfnDestroyExp = dditable->ze.RTASParallelOperationExp.pfnDestroyExp;
        if( nullptr == pfnDestroyExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_exp_object_t*>( hParallelOperation )->handle;

        // forward to device-driver
        result = pfnDestroyExp( hParallelOperation );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_rtas_parallel_operation_exp_factory.release( hParallelOperation );

        return result;
    }